

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_extend_synclo_env(sexp ctx,sexp env)

{
  sexp in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp e;
  sexp e2;
  sexp e1;
  sexp local_48;
  undefined1 *tag;
  size_t size;
  sexp psVar1;
  sexp local_28;
  sexp local_20;
  
  memset(&stack0xffffffffffffffc0,0,0x10);
  tag = &stack0xffffffffffffffd0;
  size = *(size_t *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffc0;
  if (((*(ulong *)(*(long *)(in_RDI + 0x50) + 0x18) & 3) == 0) &&
     (**(int **)(*(long *)(in_RDI + 0x50) + 0x18) == 6)) {
    local_48 = sexp_alloc_tagged_aux(in_RSI,size,(sexp_uint_t)tag);
    local_28 = (sexp)0x0;
    for (local_20 = in_RSI; local_20 != (sexp)0x0; local_20 = (local_20->value).type.name) {
      psVar1 = local_48;
      if (local_28 != (sexp)0x0) {
        local_48 = sexp_alloc_tagged_aux(local_48,size,(sexp_uint_t)tag);
        (local_28->value).type.name = local_48;
      }
      local_28 = local_48;
      (local_48->value).type.slots = (local_20->value).type.slots;
      local_48->field_0x5 = local_48->field_0x5 & 0xf7 | 8;
      (local_48->value).type.getters = (local_20->value).type.getters;
      local_48 = psVar1;
    }
    if (local_28 == (sexp)0x0) {
      return *(sexp *)(*(long *)(in_RDI + 0x28) + 0x38);
    }
    (local_28->value).flonum = *(double *)(in_RDI + 0x10);
    in_RSI = local_48;
  }
  *(size_t *)(in_RDI + 0x6080) = size;
  return in_RSI;
}

Assistant:

sexp sexp_extend_synclo_env (sexp ctx, sexp env) {
  sexp e1, e2;
  sexp_gc_var1(e);
  sexp_gc_preserve1(ctx, e);
  e = env;
  if (sexp_pairp(sexp_context_fv(ctx))) {
    e = sexp_alloc_type(ctx, env, SEXP_ENV);
    for (e1=env, e2=NULL; e1; e1=sexp_env_parent(e1)) {
      e2 = e2 ? (sexp_env_parent(e2) = sexp_alloc_type(ctx, env, SEXP_ENV)) : e;
      sexp_env_bindings(e2) = sexp_env_bindings(e1);
      sexp_env_syntactic_p(e2) = 1;
#if SEXP_USE_STABLE_ABI || SEXP_USE_RENAME_BINDINGS
      sexp_env_renames(e2) = sexp_env_renames(e1);
#endif
    }
    if (!e2) { return sexp_global(ctx, SEXP_G_OOM_ERROR); }
    sexp_env_parent(e2) = sexp_context_env(ctx);
  }
  sexp_gc_release1(ctx);
  return e;
}